

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateMIPSAssembly.cpp
# Opt level: O3

void generatePrintMIPSIml(function *fn,string *varName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint uVar4;
  bool bVar5;
  varType vVar6;
  tokenCategory tVar7;
  Reg RVar8;
  undefined8 *puVar9;
  const_iterator cVar10;
  mapped_type *__rhs;
  uint uVar11;
  size_type *psVar12;
  ulong uVar13;
  uint uVar14;
  _Alloc_hider _Var15;
  uint uVar16;
  uint __len;
  string __str;
  string varName1;
  string local_6b0;
  string local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_670 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660;
  undefined1 local_650 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_638 [2];
  pointer local_618;
  pointer local_608;
  pointer local_600;
  _Base_ptr local_5f0;
  
  getRealName(&local_690,varName,'[');
  vVar6 = whatIsThisShit(&local_690,fn);
  switch(vVar6) {
  case STR_VAR:
    local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_6b0,'\x01');
    *local_6b0._M_dataplus._M_p = '4';
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_6b0,0,(char *)0x0,0x14491b);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_650 + 0x10);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_650._16_8_ = *psVar12;
      aaStack_638[0]._0_8_ = puVar9[3];
      local_650._0_8_ = paVar1;
    }
    else {
      local_650._16_8_ = *psVar12;
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_650._8_8_ = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._0_8_ != paVar1) {
      operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
      operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::substr((ulong)&local_6b0,(ulong)&local_690);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_6b0,0,(char *)0x0,0x14494e);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_650._16_8_ = *psVar12;
      aaStack_638[0]._0_8_ = puVar9[3];
      local_650._0_8_ = paVar1;
    }
    else {
      local_650._16_8_ = *psVar12;
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_650._8_8_ = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    break;
  case LOCAL_VAR:
    function::getToken((Identifier *)local_650,fn,&local_690);
    tVar7 = tokenType::getTokenCategory((tokenType *)local_650);
    goto LAB_00131f14;
  case GLOBAL_VAR:
    identityTable::getToken((Identifier *)local_650,&globalTable,&local_690);
    tVar7 = tokenType::getTokenCategory((tokenType *)local_650);
LAB_00131f14:
    if (local_600 != (pointer)0x0) {
      operator_delete(local_600,(long)local_5f0 - (long)local_600);
    }
    if (local_618 != (pointer)0x0) {
      operator_delete(local_618,(long)local_608 - (long)local_618);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._8_8_ != aaStack_638) {
      operator_delete((void *)local_650._8_8_,aaStack_638[0]._0_8_ + 1);
    }
    if (tVar7 == INTTK) {
      uVar14 = 1;
      uVar16 = 1;
    }
    else {
      uVar16 = 2;
      uVar14 = 0xb;
    }
    paVar1 = &local_6b0.field_2;
    local_6b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_6b0,(char)uVar16);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_6b0._M_dataplus._M_p,uVar16,uVar14);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_6b0,0,(char *)0x0,0x14491b);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_650 + 0x10);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_650._16_8_ = *psVar12;
      aaStack_638[0]._0_8_ = puVar9[3];
      local_650._0_8_ = paVar2;
    }
    else {
      local_650._16_8_ = *psVar12;
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_650._8_8_ = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._0_8_ != paVar2) {
      operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
    }
    getValueOfVar(&local_6b0,varName,fn);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_6b0,0,(char *)0x0,0x144939);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_650._16_8_ = *psVar12;
      aaStack_638[0]._0_8_ = puVar9[3];
      local_650._0_8_ = paVar2;
    }
    else {
      local_650._16_8_ = *psVar12;
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_650._8_8_ = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._0_8_ != paVar2) {
      operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
    }
    local_660._M_allocated_capacity = local_6b0.field_2._M_allocated_capacity;
    _Var15._M_p = local_6b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != paVar1) goto LAB_0013256b;
    goto LAB_00132573;
  case TEMP_VAR:
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&charTypeTempVar_abi_cxx11_._M_t,varName);
    uVar16 = ((_Rb_tree_header *)cVar10._M_node !=
             &charTypeTempVar_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) + 1;
    paVar1 = &local_6b0.field_2;
    local_6b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_6b0,(char)uVar16);
    uVar14 = 0xb;
    if ((_Rb_tree_header *)cVar10._M_node ==
        &charTypeTempVar_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      uVar14 = 1;
    }
    std::__detail::__to_chars_10_impl<unsigned_int>(local_6b0._M_dataplus._M_p,uVar16,uVar14);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_6b0,0,(char *)0x0,0x14491b);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_650 + 0x10);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_650._16_8_ = *psVar12;
      aaStack_638[0]._0_8_ = puVar9[3];
      local_650._0_8_ = paVar2;
    }
    else {
      local_650._16_8_ = *psVar12;
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_650._8_8_ = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._0_8_ != paVar2) {
      operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
    }
    bVar5 = function::varHasReg(fn,&local_690);
    if (bVar5) {
      RVar8 = function::getRegOfVar(fn,&local_690,true);
      local_6b0._M_dataplus._M_p._0_4_ = RVar8;
      __rhs = std::
              map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&reg2str_abi_cxx11_,(key_type *)&local_6b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650,
                     "addu $a0 $0 ",__rhs);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
      local_660._M_allocated_capacity = local_650._16_8_;
      _Var15._M_p = (pointer)local_650._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_650._0_8_ != paVar2) goto LAB_0013256b;
      goto LAB_00132573;
    }
    __len = 1;
    uVar16 = function::getOffsetOfTemp(fn,&local_690,true);
    uVar14 = -uVar16;
    if (0 < (int)uVar16) {
      uVar14 = uVar16;
    }
    if (9 < uVar14) {
      uVar13 = (ulong)uVar14;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar11 = (uint)uVar13;
        if (uVar11 < 100) {
          __len = __len - 2;
          goto LAB_001325bc;
        }
        if (uVar11 < 1000) {
          __len = __len - 1;
          goto LAB_001325bc;
        }
        if (uVar11 < 10000) goto LAB_001325bc;
        uVar13 = uVar13 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar11);
      __len = __len + 1;
    }
LAB_001325bc:
    local_670[0] = &local_660;
    std::__cxx11::string::_M_construct((ulong)local_670,(char)__len - (char)((int)uVar16 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_670[0]->_M_local_buf + (uVar16 >> 0x1f),__len,uVar14);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)local_670,0,(char *)0x0,0x144946);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_6b0.field_2._M_allocated_capacity = *psVar12;
      local_6b0.field_2._8_8_ = puVar9[3];
      local_6b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_6b0.field_2._M_allocated_capacity = *psVar12;
      local_6b0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_6b0._M_string_length = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_6b0);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_650._16_8_ = *psVar12;
      aaStack_638[0]._0_8_ = puVar9[3];
      local_650._0_8_ = paVar2;
    }
    else {
      local_650._16_8_ = *psVar12;
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_650._8_8_ = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._0_8_ != paVar2) {
      operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
    }
    _Var15._M_p = (pointer)local_670[0];
    if (local_670[0] == &local_660) goto LAB_00132573;
    goto LAB_0013256b;
  default:
    goto switchD_00131cbe_caseD_5;
  case CHARACTER:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650,
                   "addu $a0 $0 ",varName);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_650 + 0x10)) {
      operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
    }
    local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_6b0,'\x02');
    pcVar3 = local_6b0._M_dataplus._M_p;
    pcVar3[0] = '1';
    pcVar3[1] = '1';
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_6b0,0,(char *)0x0,0x14491b);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_650._16_8_ = *psVar12;
      aaStack_638[0]._0_8_ = puVar9[3];
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_650 + 0x10);
    }
    else {
      local_650._16_8_ = *psVar12;
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_650._8_8_ = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    break;
  case INTEGER:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650,
                   "addu $a0 $0 ",varName);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_650 + 0x10)) {
      operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
    }
    local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_6b0,'\x01');
    *local_6b0._M_dataplus._M_p = '1';
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_6b0,0,(char *)0x0,0x14491b);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_650._16_8_ = *psVar12;
      aaStack_638[0]._0_8_ = puVar9[3];
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_650 + 0x10);
    }
    else {
      local_650._16_8_ = *psVar12;
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_650._8_8_ = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    break;
  case RET_VAL:
    std::__cxx11::string::substr((ulong)&local_6b0,(ulong)varName);
    functionTable::getToken((function *)local_650,&functions,&local_6b0);
    tVar7 = tokenType::getTokenCategory((tokenType *)local_650);
    function::~function((function *)local_650);
    paVar1 = &local_6b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
    }
    uVar14 = 0xb;
    if (tVar7 == INTTK) {
      uVar14 = 1;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[16]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [16])"addu $a0 $0 $v0");
    uVar16 = (tVar7 != INTTK) + 1;
    local_6b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_6b0,(char)uVar16);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_6b0._M_dataplus._M_p,uVar16,uVar14);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_6b0,0,(char *)0x0,0x14491b);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_650._16_8_ = *psVar12;
      aaStack_638[0]._0_8_ = puVar9[3];
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_650 + 0x10);
    }
    else {
      local_650._16_8_ = *psVar12;
      local_650._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_650._8_8_ = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_650 + 0x10)) {
      operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
    }
    local_660._M_allocated_capacity = local_6b0.field_2._M_allocated_capacity;
    _Var15._M_p = local_6b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != paVar1) goto LAB_0013256b;
    goto LAB_00132573;
  }
  if ((undefined1 *)local_650._0_8_ != local_650 + 0x10) {
    operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
  }
  local_660._M_allocated_capacity = local_6b0.field_2._M_allocated_capacity;
  _Var15._M_p = local_6b0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
LAB_0013256b:
    operator_delete(_Var15._M_p,local_660._M_allocated_capacity + 1);
  }
LAB_00132573:
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[8]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &mipsCode_abi_cxx11_,(char (*) [8])"syscall");
switchD_00131cbe_caseD_5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void generatePrintMIPSIml(function &fn, string &varName) {
    string varName1 = getRealName(varName, '[');
    varType type = whatIsThisShit(varName1, fn);
    int service;
    switch (type) {
        case TEMP_VAR: {
            if (charTypeTempVar.count(varName) != 0)
                service = syscallService[PRINT_CHAR];
            else
                service = syscallService[PRINT_INT];
            mipsCode.emplace_back("li $v0 " + to_string(service));
            if (fn.varHasReg(varName1)) {//寄存器里有值
                mipsCode.emplace_back("addu $a0 $0 " + reg2str.at(fn.getRegOfVar(varName1, true)));
            } else {//栈里有值
                int offset = fn.getOffsetOfTemp(varName1, true);
                mipsCode.emplace_back("lw $a0 " + to_string(offset) + "($sp)");
            }
            mipsCode.emplace_back("syscall");
            break;
        }
        case STR_VAR: {
            service = syscallService[PRINT_STR];
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("la $a0 " + varName1.substr(1, varName1.length() - 1));
            mipsCode.emplace_back("syscall");
            break;
        }
        case LOCAL_VAR:
        case GLOBAL_VAR: {
            if (type == LOCAL_VAR) {
                if (fn.getToken(varName1).getTokenCategory() == INTTK)
                    service = syscallService[PRINT_INT];
                else
                    service = service = syscallService[PRINT_CHAR];
            } else {
                if (globalTable.getToken(varName1).getTokenCategory() == INTTK)
                    service = syscallService[PRINT_INT];
                else
                    service = service = syscallService[PRINT_CHAR];
            }
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("addu $a0 $0 " + getValueOfVar(varName, fn));
            mipsCode.emplace_back("syscall");
            break;
        }
        case RET_VAL: {
            if (functions.getToken(varName.substr(5, varName.size() - 5)).getTokenCategory() == INTTK)
                service = syscallService[PRINT_INT];
            else
                service = service = syscallService[PRINT_CHAR];
            mipsCode.emplace_back("addu $a0 $0 $v0");
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("syscall");
            break;
        }
        case INTEGER: {
            service = syscallService[PRINT_INT];
            mipsCode.emplace_back("addu $a0 $0 " + varName);
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("syscall");
            break;
        }
        case CHARACTER: {
            service = syscallService[PRINT_CHAR];
            mipsCode.emplace_back("addu $a0 $0 " + varName);
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("syscall");
            break;
        }
        default:
            break;
    }
}